

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int *piVar1;
  byte bVar2;
  sqlite3 *db;
  Db *pDVar3;
  Pager *pPVar4;
  Btree *pBVar5;
  char *pcVar6;
  Btree *pBVar7;
  Schema *pSVar8;
  u8 uVar9;
  undefined6 uVar10;
  u8 uVar11;
  u8 uVar12;
  undefined6 uVar13;
  int iVar14;
  int iVar15;
  char *zUri;
  char *pcVar16;
  Db *pDVar17;
  sqlite3_vfs *pVfs_00;
  Schema *pSVar18;
  int iVar19;
  Btree **ppBtree;
  char *pcVar20;
  long lVar21;
  char *zErrDyn;
  uint flags;
  char *zPath;
  sqlite3_vfs *pVfs;
  char *zErr;
  char *local_58;
  uint local_4c;
  char *local_48;
  sqlite3_vfs *local_40;
  char *local_38;
  
  db = context->pOut->db;
  local_48 = (char *)0x0;
  local_38 = (char *)0x0;
  local_58 = (char *)0x0;
  zUri = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar16 = (char *)sqlite3ValueText(argv[1],'\x01');
  if (zUri == (char *)0x0) {
    zUri = "";
  }
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "";
  }
  if (((db->init).field_0x6 & 4) == 0) {
    iVar15 = db->nDb;
    if (db->aLimit[7] + 2 <= iVar15) {
      iVar15 = 0;
      local_58 = sqlite3MPrintf(db,"too many attached databases - max %d");
      goto LAB_00195fac;
    }
    if (0 < iVar15) {
      iVar19 = 0;
      do {
        iVar14 = sqlite3DbIsNamed(db,iVar19,pcVar16);
        if (iVar14 != 0) {
          pcVar20 = "database %s is already in use";
          iVar15 = 0;
          goto LAB_00195d3e;
        }
        iVar19 = iVar19 + 1;
      } while (iVar15 != iVar19);
    }
    if (db->aDb == db->aDbStatic) {
      pDVar17 = (Db *)sqlite3DbMallocRawNN(db,0x60);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
      pDVar3 = db->aDb;
      pcVar20 = pDVar3->zDbSName;
      pBVar5 = pDVar3->pBt;
      uVar11 = pDVar3->safety_level;
      uVar12 = pDVar3->bSyncSet;
      uVar13 = *(undefined6 *)&pDVar3->field_0x12;
      pSVar18 = pDVar3->pSchema;
      pcVar6 = pDVar3[1].zDbSName;
      pBVar7 = pDVar3[1].pBt;
      uVar9 = pDVar3[1].bSyncSet;
      uVar10 = *(undefined6 *)&pDVar3[1].field_0x12;
      pSVar8 = pDVar3[1].pSchema;
      pDVar17[1].safety_level = pDVar3[1].safety_level;
      pDVar17[1].bSyncSet = uVar9;
      *(undefined6 *)&pDVar17[1].field_0x12 = uVar10;
      pDVar17[1].pSchema = pSVar8;
      pDVar17[1].zDbSName = pcVar6;
      pDVar17[1].pBt = pBVar7;
      pDVar17->safety_level = uVar11;
      pDVar17->bSyncSet = uVar12;
      *(undefined6 *)&pDVar17->field_0x12 = uVar13;
      pDVar17->pSchema = pSVar18;
      pDVar17->zDbSName = pcVar20;
      pDVar17->pBt = pBVar5;
    }
    else {
      pDVar17 = (Db *)sqlite3DbRealloc(db,db->aDb,(long)iVar15 * 0x20 + 0x20);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
    }
    db->aDb = pDVar17;
    iVar15 = db->nDb;
    pDVar3 = pDVar17 + iVar15;
    pDVar3->safety_level = '\0';
    pDVar3->bSyncSet = '\0';
    *(undefined6 *)&pDVar3->field_0x12 = 0;
    *(Schema **)(&pDVar3->safety_level + 8) = (Schema *)0x0;
    pDVar17[iVar15].zDbSName = (char *)0x0;
    pDVar17[iVar15].pBt = (Btree *)0x0;
    local_4c = db->openFlags;
    iVar19 = sqlite3ParseUri(db->pVfs->zName,zUri,&local_4c,&local_40,&local_48,&local_38);
    if (iVar19 != 0) {
      if (iVar19 == 7) {
        sqlite3OomFault(db);
      }
      pcVar16 = local_38;
      context->isError = 1;
      sqlite3VdbeMemSetStr
                (context->pOut,local_38,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar16);
      return;
    }
    pDVar17 = pDVar17 + iVar15;
    local_4c = local_4c | 0x100;
    iVar15 = sqlite3BtreeOpen(local_40,local_48,db,&pDVar17->pBt,0,local_4c);
    db->nDb = db->nDb + 1;
    pcVar16 = sqlite3DbStrDup(db,pcVar16);
    pDVar17->zDbSName = pcVar16;
  }
  else {
    pVfs_00 = sqlite3_vfs_find("memdb");
    if (pVfs_00 == (sqlite3_vfs *)0x0) {
      return;
    }
    bVar2 = (db->init).iDb;
    pDVar17 = db->aDb + bVar2;
    ppBtree = &db->aDb[bVar2].pBt;
    pBVar5 = *ppBtree;
    local_40 = pVfs_00;
    if (pBVar5 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar5);
    }
    pDVar17->pBt = (Btree *)0x0;
    pDVar17->pSchema = (Schema *)0x0;
    iVar15 = sqlite3BtreeOpen(pVfs_00,"x",db,ppBtree,0,0x100);
  }
  db->noSharedCache = '\0';
  if (iVar15 == 0) {
    pSVar18 = sqlite3SchemaGet(db,pDVar17->pBt);
    pDVar17->pSchema = pSVar18;
    if (pSVar18 == (Schema *)0x0) {
      iVar15 = 7;
    }
    else {
      iVar15 = 0;
      if ((pSVar18->file_format != '\0') && (pSVar18->enc != db->enc)) {
        local_58 = sqlite3MPrintf(db,
                                  "attached databases must use the same text encoding as main database"
                                 );
        iVar15 = 1;
      }
    }
    pBVar5 = pDVar17->pBt;
    if ((pBVar5->sharable != '\0') &&
       (pBVar5->wantToLock = pBVar5->wantToLock + 1, pBVar5->locked == '\0')) {
      btreeLockCarefully(pBVar5);
    }
    pBVar5 = pDVar17->pBt;
    pPVar4 = pBVar5->pBt->pPager;
    if (pPVar4->tempFile == '\0') {
      if ((pPVar4->pWal == (Wal *)0x0) || (pPVar4->pWal->exclusiveMode != '\x02')) {
        pPVar4->exclusiveMode = db->dfltLockMode;
      }
    }
    iVar19 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
    sqlite3BtreeSecureDelete(pBVar5,iVar19);
    sqlite3BtreeSetPagerFlags(pDVar17->pBt,(uint)db->flags & 0x38 | 3);
    pBVar5 = pDVar17->pBt;
    if (pBVar5->sharable != '\0') {
      piVar1 = &pBVar5->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(pBVar5);
      }
    }
  }
  else if (iVar15 == 0x13) {
    local_58 = sqlite3MPrintf(db,"database is already attached");
    iVar15 = 1;
  }
  pDVar17->safety_level = '\x03';
  if ((iVar15 == 0) && (iVar15 = 7, pDVar17->zDbSName != (char *)0x0)) {
    iVar15 = 0;
  }
  sqlite3_free_filename(local_48);
  if (iVar15 == 0) {
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    (db->init).iDb = '\0';
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
    iVar15 = 0;
    if (((db->init).field_0x6 & 4) == 0) {
      iVar15 = sqlite3Init(db,&local_58);
    }
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
  }
  if (iVar15 == 0) {
    return;
  }
  if (((db->init).field_0x6 & 4) == 0) {
    lVar21 = (long)db->nDb + -1;
    pBVar5 = db->aDb[lVar21].pBt;
    if (pBVar5 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar5);
      pDVar17 = db->aDb;
      pDVar17[lVar21].pBt = (Btree *)0x0;
      pDVar17[lVar21].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar21;
    if ((iVar15 == 0xc0a) || (iVar15 == 7)) {
      sqlite3OomFault(db);
      if (local_58 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_58);
      }
      local_58 = sqlite3MPrintf(db,"out of memory");
    }
    else if (local_58 == (char *)0x0) {
      pcVar20 = "unable to open database: %s";
      pcVar16 = zUri;
LAB_00195d3e:
      local_58 = sqlite3MPrintf(db,pcVar20,pcVar16);
    }
  }
LAB_00195fac:
  if (local_58 != (char *)0x0) {
    context->isError = 1;
    sqlite3VdbeMemSetStr(context->pOut,local_58,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
    ;
    if (local_58 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_58);
    }
  }
  if (iVar15 != 0) {
    sqlite3_result_error_code(context,iVar15);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifndef SQLITE_OMIT_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    pNew = &db->aDb[db->init.iDb];
    if( pNew->pBt ) sqlite3BtreeClose(pNew->pBt);
    pNew->pBt = 0;
    pNew->pSchema = 0;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNew->pBt, 0, SQLITE_OPEN_MAIN_DB);
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d",
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      assert( zName );
      if( sqlite3DbIsNamed(db, i, zName) ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }

    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));

    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db,
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3_free_filename( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( !REOPEN_AS_MEMDB(db) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }

  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}